

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCSI.cpp
# Opt level: O1

void __thiscall SCSI::Bus::Bus(Bus *this,HalfCycles clock_rate)

{
  double dVar1;
  
  (this->super_Source).observer_ = (Observer *)0x0;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_005ab040;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005ab060;
  (this->time_in_state_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->dispatch_index_ = 0;
  dVar1 = 1.0 / (double)(long)clock_rate.super_WrappedInt<HalfCycles>.length_;
  (this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->observers_).
  super__Vector_base<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->observers_).
  super__Vector_base<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->observers_).
  super__Vector_base<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->activity_observer_ = (Observer *)0x0;
  this->cycles_to_time_ = dVar1;
  (this->dispatch_times_)._M_elems[0] = (long)(1e-08 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[1] = (long)(4.5e-08 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[2] = (long)(1e-07 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[3] = (long)(4.5e-07 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[4] = (long)(6.5e-07 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[5] = (long)(1.1e-06 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[6] = (long)(1.7e-06 / dVar1) + 1;
  (this->dispatch_times_)._M_elems[7] = (long)(2.5e-05 / dVar1) + 1;
  return;
}

Assistant:

Bus::Bus(HalfCycles clock_rate) {
	cycles_to_time_ = 1.0 / double(clock_rate.as_integral());

	// NB: note that the dispatch times below are **ORDERED**
	// from least to greatest. Each box should contain the number
	// of whole clock periods it will take to get the the first
	// discrete moment after the required delay interval has been met.
	using IntType = Cycles::IntType;
	dispatch_times_[0] = 1 + IntType(CableSkew / cycles_to_time_);
	dispatch_times_[1] = 1 + IntType(DeskewDelay / cycles_to_time_);
	dispatch_times_[2] = 1 + IntType(BusFreeDelay / cycles_to_time_);
	dispatch_times_[3] = 1 + IntType(BusSettleDelay / cycles_to_time_);
	dispatch_times_[4] = 1 + IntType(BusClearDelay / cycles_to_time_);
	dispatch_times_[5] = 1 + IntType(BusSetDelay / cycles_to_time_);
	dispatch_times_[6] = 1 + IntType(ArbitrationDelay / cycles_to_time_);
	dispatch_times_[7] = 1 + IntType(ResetHoldTime / cycles_to_time_);
}